

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjTransform(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int n,uchar **dstBufs,
               unsigned_long *dstSizes,tjtransform *t,int flags)

{
  j_decompress_ptr cinfo;
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  JDIMENSION *pJVar5;
  int iVar6;
  int iVar7;
  boolean bVar8;
  int iVar9;
  undefined8 *puVar10;
  code **ppcVar11;
  jpeg_transform_info *__ptr;
  void *pvVar12;
  jvirt_barray_ptr *src_coef_arrays;
  unsigned_long uVar13;
  jvirt_barray_ptr *coef_arrays;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  JDIMENSION *pJVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  tjtransform *ptVar21;
  char *pcVar22;
  int *piVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  jpeg_transform_info *pjVar29;
  undefined1 auVar30 [16];
  tjregion tVar31;
  code *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  tjhandle local_38;
  
  if (handle == (tjhandle)0x0) {
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_00199f20);
    *(undefined8 *)((long)puVar10 + 7) = 0x656c646e616820;
    *puVar10 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  uVar16 = 0xffffffff;
  iVar7 = 1;
  if ((~*(uint *)((long)handle + 0x600) & 3) != 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjTransform(): Instance has not been initialized for transformation",0x44);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar12 = (void *)__tls_get_addr(&PTR_00199f20);
    memcpy(pvVar12,"tjTransform(): Instance has not been initialized for transformation",0x44);
    __ptr = (jpeg_transform_info *)0x0;
    goto LAB_001375ac;
  }
  auVar30._0_4_ = -(uint)(jpegBuf == (uchar *)0x0);
  auVar30._4_4_ = -(uint)(dstBufs == (uchar **)0x0);
  auVar30._8_4_ = -(uint)(dstSizes == (unsigned_long *)0x0);
  auVar30._12_4_ = -(uint)(t == (tjtransform *)0x0);
  iVar6 = movmskps(~*(uint *)((long)handle + 0x600),auVar30);
  if ((((iVar6 != 0) || (n < 1)) || (flags < 0)) || (jpegSize == 0)) {
    builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
    builtin_strncpy((char *)((long)handle + 0x610),"orm(): I",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar22 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar22,"tjTransform(): Invalid argument",0x20);
    __ptr = (jpeg_transform_info *)0x0;
    goto LAB_001375ac;
  }
  if ((flags & 8U) == 0) {
    if ((flags & 0x10U) != 0) {
      pcVar22 = "JSIMD_FORCESSE=1";
      goto LAB_00136ec5;
    }
    if ((flags & 0x20U) != 0) {
      pcVar22 = "JSIMD_FORCESSE2=1";
      goto LAB_00136ec5;
    }
  }
  else {
    pcVar22 = "JSIMD_FORCEMMX=1";
LAB_00136ec5:
    putenv(pcVar22);
  }
  if ((short)flags < 0) {
    ppcVar11 = &local_58;
    local_50 = 0;
    uStack_48 = 0;
    local_40 = 0;
    local_58 = my_progress_monitor;
    local_38 = handle;
  }
  else {
    ppcVar11 = (code **)0x0;
  }
  *(code ***)((long)handle + 0x218) = ppcVar11;
  uVar25 = (ulong)(uint)n;
  __ptr = (jpeg_transform_info *)calloc(1,uVar25 * 0x78);
  if (__ptr == (jpeg_transform_info *)0x0) {
    builtin_strncpy((char *)((long)handle + 0x621),"ocation ",8);
    builtin_strncpy((char *)((long)handle + 0x629),"failure",8);
    builtin_strncpy((char *)((long)handle + 0x618),"emory al",8);
    builtin_strncpy((char *)((long)handle + 0x620),"location",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
    builtin_strncpy((char *)((long)handle + 0x610),"orm(): M",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar22 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar22,"tjTransform(): Memory allocation failure",0x29);
    __ptr = (jpeg_transform_info *)0x0;
    iVar7 = 1;
    uVar16 = 0xffffffff;
  }
  else {
    iVar7 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar7 == 0) {
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      piVar23 = &t->options;
      bVar4 = 0;
      for (lVar24 = 0; uVar25 * 0x78 - lVar24 != 0; lVar24 = lVar24 + 0x78) {
        uVar16 = piVar23[-1];
        *(JXFORM_CODE *)((long)&__ptr->transform + lVar24) = xformtypes[(int)uVar16];
        uVar2 = *piVar23;
        *(uint *)((long)&__ptr->perfect + lVar24) = uVar2 & 1;
        *(uint *)((long)&__ptr->trim + lVar24) = uVar2 >> 1 & 1;
        *(uint *)((long)&__ptr->force_grayscale + lVar24) = uVar2 >> 3 & 1;
        uVar28 = uVar2 >> 2 & 1;
        *(uint *)((long)&__ptr->crop + lVar24) = uVar28;
        *(uint *)((long)&__ptr->slow_hflip + lVar24) = (uint)((long)(int)uVar16 == 1 && n != 1);
        if (uVar28 != 0) {
          *(int *)((long)&__ptr->crop_xoffset + lVar24) = (((tjtransform *)(piVar23 + -5))->r).x;
          *(undefined4 *)((long)&__ptr->crop_xoffset_set + lVar24) = 1;
          *(int *)((long)&__ptr->crop_yoffset + lVar24) = piVar23[-4];
          *(undefined4 *)((long)&__ptr->crop_yoffset_set + lVar24) = 1;
          uVar16 = piVar23[-3];
          if (uVar16 != 0) {
            *(undefined4 *)((long)&__ptr->crop_width_set + lVar24) = 1;
          }
          *(uint *)((long)&__ptr->crop_width + lVar24) = uVar16;
          if (piVar23[-2] == 0) {
            *(undefined4 *)((long)&__ptr->crop_height + lVar24) = 0;
          }
          else {
            *(int *)((long)&__ptr->crop_height + lVar24) = piVar23[-2];
            *(undefined4 *)((long)&__ptr->crop_height_set + lVar24) = 1;
          }
        }
        if ((uVar2 & 0x40) == 0) {
          bVar4 = 1;
        }
        piVar23 = piVar23 + 10;
      }
      jcopy_markers_setup(cinfo,(uint)bVar4 * 2);
      iVar7 = 1;
      jpeg_read_header(cinfo,1);
      iVar6 = getSubsamp(cinfo);
      if (-1 < iVar6) {
        pjVar29 = __ptr;
        for (lVar24 = 0; uVar25 * 0x28 - lVar24 != 0; lVar24 = lVar24 + 0x28) {
          bVar8 = jtransform_request_workspace(cinfo,pjVar29);
          if (bVar8 == 0) {
            builtin_strncpy((char *)((long)handle + 0x618),"ransform",8);
            builtin_strncpy((char *)((long)handle + 0x620)," is not ",8);
            builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
            builtin_strncpy((char *)((long)handle + 0x610),"orm(): T",8);
            *(undefined8 *)((long)handle + 0x628) = 0x74636566726570;
            *(undefined4 *)((long)handle + 0x6d0) = 1;
            pcVar22 = (char *)__tls_get_addr(&PTR_00199f20);
            builtin_strncpy(pcVar22,"tjTransform(): Transform is not perfect",0x28);
            goto LAB_001375a1;
          }
          if (pjVar29->crop != 0) {
            if (*(int *)((long)&(t->r).x + lVar24) % pjVar29->iMCU_sample_width == 0) {
              uVar16 = pjVar29->iMCU_sample_height;
              if (*(int *)((long)&(t->r).y + lVar24) % (int)uVar16 == 0) goto LAB_0013715f;
            }
            else {
              uVar16 = pjVar29->iMCU_sample_height;
            }
            snprintf((char *)((long)handle + 0x608),200,
                     "To crop this JPEG image, x must be a multiple of %d\nand y must be a multiple of %d.\n"
                     ,(ulong)(uint)pjVar29->iMCU_sample_width,(ulong)uVar16);
            *(undefined4 *)((long)handle + 0x6d0) = 1;
            goto LAB_001375a1;
          }
LAB_0013715f:
          pjVar29 = pjVar29 + 1;
        }
        src_coef_arrays = jpeg_read_coefficients(cinfo);
        iVar7 = 1;
        for (uVar15 = 0; uVar15 != uVar25; uVar15 = uVar15 + 1) {
          pjVar29 = __ptr + uVar15;
          if (((uint)flags >> 10 & 1) != 0) {
            pJVar17 = &pjVar29->crop_width;
            pJVar5 = &pjVar29->crop_height;
            if (pjVar29->crop == 0) {
              pJVar17 = (JDIMENSION *)((long)handle + 0x238);
              pJVar5 = (JDIMENSION *)((long)handle + 0x23c);
            }
            uVar13 = tjBufSize(*pJVar17,*pJVar5,iVar6);
            dstSizes[uVar15] = uVar13;
            iVar7 = 0;
          }
          if ((t[uVar15].options & 0x10) == 0) {
            jpeg_mem_dest_tj((j_compress_ptr)handle,dstBufs + uVar15,dstSizes + uVar15,iVar7);
          }
          ptVar21 = t + uVar15;
          jpeg_copy_critical_parameters(cinfo,(j_compress_ptr)handle);
          coef_arrays = jtransform_adjust_parameters
                                  (cinfo,(j_compress_ptr)handle,src_coef_arrays,pjVar29);
          if ((((uint)flags >> 0xe & 1) != 0) || (uVar16 = ptVar21->options, (uVar16 & 0x20) != 0))
          {
            jpeg_simple_progression((j_compress_ptr)handle);
            uVar16 = ptVar21->options;
          }
          if ((uVar16 & 0x10) == 0) {
            jpeg_write_coefficients((j_compress_ptr)handle,coef_arrays);
            jcopy_markers_execute
                      (cinfo,(j_compress_ptr)handle,(uint)~ptVar21->options >> 5 & JCOPYOPT_ALL);
          }
          else {
            jinit_c_master_control((j_compress_ptr)handle,1);
          }
          jtransform_execute_transform(cinfo,(j_compress_ptr)handle,src_coef_arrays,pjVar29);
          if (ptVar21->customFilter !=
              (_func_int_short_ptr_tjregion_tjregion_int_int_tjtransform_ptr *)0x0) {
            for (lVar24 = 0; lVar24 < *(int *)((long)handle + 0x4c); lVar24 = lVar24 + 1) {
              lVar26 = *(long *)((long)handle + 0x58);
              lVar18 = lVar24 * 0x60;
              lVar1 = lVar26 + lVar18;
              uVar14 = (ulong)*(uint *)(lVar26 + 0x20 + lVar18);
              uVar19 = (ulong)(uint)(*(int *)(lVar26 + 0x1c + lVar18) << 3);
              uVar20 = uVar14 << 0x23;
              tVar31._8_8_ = uVar19 | 0x800000000;
              lVar26 = 0;
              for (uVar16 = 0; uVar16 < (uint)uVar14; uVar16 = *(int *)(lVar1 + 0xc) + uVar16) {
                lVar18 = (**(code **)(*(long *)((long)handle + 0x210) + 0x40))
                                   (cinfo,coef_arrays[lVar24],uVar16,*(undefined4 *)(lVar1 + 0xc),1)
                ;
                for (lVar27 = 0; lVar27 < *(int *)(lVar1 + 0xc); lVar27 = lVar27 + 1) {
                  tVar31.x = (int)lVar26;
                  tVar31.y = (int)((ulong)lVar26 >> 0x20);
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = uVar20 | uVar19;
                  iVar9 = (*ptVar21->customFilter)
                                    (*(short **)(lVar18 + lVar27 * 8),tVar31,
                                     (tjregion)(auVar3 << 0x40),(int)lVar24,(int)uVar15,ptVar21);
                  if (iVar9 == -1) {
                    builtin_strncpy((char *)((long)handle + 0x618),"rror in ",8);
                    builtin_strncpy((char *)((long)handle + 0x620),"custom f",8);
                    builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
                    builtin_strncpy((char *)((long)handle + 0x610),"orm(): E",8);
                    *(undefined8 *)((long)handle + 0x626) = 0x7265746c696620;
                    *(undefined4 *)((long)handle + 0x6d0) = 1;
                    pcVar22 = (char *)__tls_get_addr(&PTR_00199f20);
                    builtin_strncpy(pcVar22,"tjTransform(): Error in custom filter",0x26);
                    goto LAB_001375a1;
                  }
                  lVar26 = lVar26 + 0x800000000;
                }
                uVar14 = (ulong)*(uint *)(lVar1 + 0x20);
              }
            }
          }
          if ((ptVar21->options & 0x10) == 0) {
            jpeg_finish_compress((j_compress_ptr)handle);
          }
        }
        jpeg_finish_decompress(cinfo);
        uVar16 = 0;
        goto LAB_001375ac;
      }
      memcpy((void *)((long)handle + 0x608),
             "tjTransform(): Could not determine subsampling type for JPEG image",0x43);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pvVar12 = (void *)__tls_get_addr(&PTR_00199f20);
      memcpy(pvVar12,"tjTransform(): Could not determine subsampling type for JPEG image",0x43);
    }
    else {
      iVar7 = 1;
    }
LAB_001375a1:
    uVar16 = 0xffffffff;
  }
LAB_001375ac:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (iVar7 != 0) {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  free(__ptr);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar16;
}

Assistant:

DLLEXPORT int tjTransform(tjhandle handle, const unsigned char *jpegBuf,
                          unsigned long jpegSize, int n,
                          unsigned char **dstBufs, unsigned long *dstSizes,
                          tjtransform *t, int flags)
{
  jpeg_transform_info *xinfo = NULL;
  jvirt_barray_ptr *srccoefs, *dstcoefs;
  int retval = 0, alloc = 1, i, jpegSubsamp, saveMarkers = 0;
  struct my_progress_mgr progress;

  GET_INSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0 || (this->init & DECOMPRESS) == 0)
    THROW("tjTransform(): Instance has not been initialized for transformation");

  if (jpegBuf == NULL || jpegSize <= 0 || n < 1 || dstBufs == NULL ||
      dstSizes == NULL || t == NULL || flags < 0)
    THROW("tjTransform(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if ((xinfo =
       (jpeg_transform_info *)malloc(sizeof(jpeg_transform_info) * n)) == NULL)
    THROW("tjTransform(): Memory allocation failure");
  MEMZERO(xinfo, sizeof(jpeg_transform_info) * n);

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);

  for (i = 0; i < n; i++) {
    xinfo[i].transform = xformtypes[t[i].op];
    xinfo[i].perfect = (t[i].options & TJXOPT_PERFECT) ? 1 : 0;
    xinfo[i].trim = (t[i].options & TJXOPT_TRIM) ? 1 : 0;
    xinfo[i].force_grayscale = (t[i].options & TJXOPT_GRAY) ? 1 : 0;
    xinfo[i].crop = (t[i].options & TJXOPT_CROP) ? 1 : 0;
    if (n != 1 && t[i].op == TJXOP_HFLIP) xinfo[i].slow_hflip = 1;
    else xinfo[i].slow_hflip = 0;

    if (xinfo[i].crop) {
      xinfo[i].crop_xoffset = t[i].r.x;  xinfo[i].crop_xoffset_set = JCROP_POS;
      xinfo[i].crop_yoffset = t[i].r.y;  xinfo[i].crop_yoffset_set = JCROP_POS;
      if (t[i].r.w != 0) {
        xinfo[i].crop_width = t[i].r.w;  xinfo[i].crop_width_set = JCROP_POS;
      } else
        xinfo[i].crop_width = JCROP_UNSET;
      if (t[i].r.h != 0) {
        xinfo[i].crop_height = t[i].r.h;  xinfo[i].crop_height_set = JCROP_POS;
      } else
        xinfo[i].crop_height = JCROP_UNSET;
    }
    if (!(t[i].options & TJXOPT_COPYNONE)) saveMarkers = 1;
  }

  jcopy_markers_setup(dinfo, saveMarkers ? JCOPYOPT_ALL : JCOPYOPT_NONE);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjTransform(): Could not determine subsampling type for JPEG image");

  for (i = 0; i < n; i++) {
    if (!jtransform_request_workspace(dinfo, &xinfo[i]))
      THROW("tjTransform(): Transform is not perfect");

    if (xinfo[i].crop) {
      if ((t[i].r.x % xinfo[i].iMCU_sample_width) != 0 ||
          (t[i].r.y % xinfo[i].iMCU_sample_height) != 0) {
        snprintf(this->errStr, JMSG_LENGTH_MAX,
                 "To crop this JPEG image, x must be a multiple of %d\n"
                 "and y must be a multiple of %d.\n",
                 xinfo[i].iMCU_sample_width, xinfo[i].iMCU_sample_height);
        this->isInstanceError = TRUE;
        retval = -1;  goto bailout;
      }
    }
  }

  srccoefs = jpeg_read_coefficients(dinfo);

  for (i = 0; i < n; i++) {
    int w, h;

    if (!xinfo[i].crop) {
      w = dinfo->image_width;  h = dinfo->image_height;
    } else {
      w = xinfo[i].crop_width;  h = xinfo[i].crop_height;
    }
    if (flags & TJFLAG_NOREALLOC) {
      alloc = 0;  dstSizes[i] = tjBufSize(w, h, jpegSubsamp);
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT))
      jpeg_mem_dest_tj(cinfo, &dstBufs[i], &dstSizes[i], alloc);
    jpeg_copy_critical_parameters(dinfo, cinfo);
    dstcoefs = jtransform_adjust_parameters(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (flags & TJFLAG_PROGRESSIVE || t[i].options & TJXOPT_PROGRESSIVE)
      jpeg_simple_progression(cinfo);
    if (!(t[i].options & TJXOPT_NOOUTPUT)) {
      jpeg_write_coefficients(cinfo, dstcoefs);
      jcopy_markers_execute(dinfo, cinfo, t[i].options & TJXOPT_COPYNONE ?
                                          JCOPYOPT_NONE : JCOPYOPT_ALL);
    } else
      jinit_c_master_control(cinfo, TRUE);
    jtransform_execute_transformation(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (t[i].customFilter) {
      int ci, y;
      JDIMENSION by;

      for (ci = 0; ci < cinfo->num_components; ci++) {
        jpeg_component_info *compptr = &cinfo->comp_info[ci];
        tjregion arrayRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE, DCTSIZE
        };
        tjregion planeRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE,
          compptr->height_in_blocks * DCTSIZE
        };

        for (by = 0; by < compptr->height_in_blocks;
             by += compptr->v_samp_factor) {
          JBLOCKARRAY barray = (dinfo->mem->access_virt_barray)
            ((j_common_ptr)dinfo, dstcoefs[ci], by, compptr->v_samp_factor,
             TRUE);

          for (y = 0; y < compptr->v_samp_factor; y++) {
            if (t[i].customFilter(barray[y][0], arrayRegion, planeRegion, ci,
                                  i, &t[i]) == -1)
              THROW("tjTransform(): Error in custom filter");
            arrayRegion.y += DCTSIZE;
          }
        }
      }
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT)) jpeg_finish_compress(cinfo);
  }

  jpeg_finish_decompress(dinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(xinfo);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}